

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O2

void __thiscall pstack::Procman::StackFrame::getCoreRegs(StackFrame *this,CoreRegisters *core)

{
  unsigned_long_long uVar1;
  
  core->rdx = (this->regs).rdx;
  uVar1 = (this->regs).rcx;
  core->rax = (this->regs).rax;
  core->rcx = uVar1;
  uVar1 = (this->regs).rdi;
  core->rsi = (this->regs).rsi;
  core->rdi = uVar1;
  uVar1 = (this->regs).rbx;
  core->rbp = (this->regs).rbp;
  core->rbx = uVar1;
  core->rsp = (this->regs).rsp;
  uVar1 = (this->regs).r8;
  core->r9 = (this->regs).r9;
  core->r8 = uVar1;
  uVar1 = (this->regs).r10;
  core->r11 = (this->regs).r11;
  core->r10 = uVar1;
  uVar1 = (this->regs).r12;
  core->r13 = (this->regs).r13;
  core->r12 = uVar1;
  uVar1 = (this->regs).r14;
  core->r15 = (this->regs).r15;
  core->r14 = uVar1;
  core->eflags = (this->regs).eflags;
  core->es = (this->regs).es;
  uVar1 = (this->regs).cs;
  core->rip = (this->regs).rip;
  core->cs = uVar1;
  core->ds = (this->regs).ds;
  uVar1 = (this->regs).gs;
  core->fs = (this->regs).fs;
  core->gs = uVar1;
  uVar1 = (this->regs).fs_base;
  core->ss = (this->regs).ss;
  core->fs_base = uVar1;
  core->gs_base = (this->regs).gs_base;
  return;
}

Assistant:

void
StackFrame::getCoreRegs(Elf::CoreRegisters &core) const
{
#define REGMAP(number, field) core.field = Elf::getReg(regs, number);
#include "libpstack/archreg.h"
#undef REGMAP
}